

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationTOIDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
SimulationTOIDecPOMDPDiscrete::Step
          (SimulationTOIDecPOMDPDiscrete *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs,uint t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *oIs,double *r,double *sumR,
          double specialR)

{
  TOIDecPOMDPDiscrete *pTVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  PlanningUnitTOIDecPOMDPDiscrete *pPVar3;
  MultiAgentDecisionProcessDiscreteInterface *pMVar4;
  pointer puVar5;
  undefined1 auVar6 [16];
  int iVar7;
  undefined4 uVar8;
  ostream *poVar9;
  State *pSVar10;
  long *plVar11;
  pointer puVar12;
  double dVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> sIs_suc;
  stringstream ss;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_408;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_3f0;
  ostream *local_3e8;
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_340 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  TransitionObservationIndependentMADPDiscrete::SampleSuccessorState
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_408,
             &this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
              super_TransitionObservationIndependentMADPDiscrete,sIs,aIs);
  TransitionObservationIndependentMADPDiscrete::SampleJointObservation
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_340,
             &this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
              super_TransitionObservationIndependentMADPDiscrete,aIs,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_408);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(oIs,local_340);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(local_340);
  pTVar1 = this->_m_puTOI->_m_TOIDecPOMDPDiscrete;
  dVar13 = (double)(**(code **)(*(long *)&(pTVar1->
                                          super_TransitionObservationIndependentMADPDiscrete).
                                          super_MultiAgentDecisionProcess + 0x170))(pTVar1,sIs,aIs);
  *r = dVar13 + specialR;
  pDVar2 = (this->_m_puTOI->super_PlanningUnitDecPOMDPDiscrete)._m_DecPOMDP;
  auVar16 = (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0)) +
                        0x70))((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0));
  auVar15._0_8_ = auVar16._8_8_;
  auVar15._8_56_ = extraout_var_00;
  auVar6 = vcvtusi2sd_avx512f(auVar15._0_16_,t);
  auVar14._0_8_ = pow(auVar16._0_8_,auVar6._0_8_);
  auVar14._8_56_ = extraout_var;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar13 + specialR;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *sumR;
  auVar6 = vfmadd213sd_fma(auVar14._0_16_,auVar16,auVar6);
  *sumR = auVar6._0_8_;
  if ((this->super_SimulationDecPOMDPDiscrete).super_Simulation._m_verbose == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Simulation::RunSimulation ");
    poVar9 = std::operator<<(poVar9,"(");
    pSVar10 = TransitionObservationIndependentMADPDiscrete::GetState
                        (&this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
                          super_TransitionObservationIndependentMADPDiscrete,sIs);
    (*(pSVar10->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[3])(local_380,pSVar10);
    poVar9 = std::operator<<(poVar9,local_380);
    poVar9 = std::operator<<(poVar9,",");
    pPVar3 = this->_m_puTOI;
    iVar7 = (*(pPVar3->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete.
              super_PlanningUnit._vptr_PlanningUnit[9])(pPVar3,aIs);
    pMVar4 = (pPVar3->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete._m_madp;
    plVar11 = (long *)(**(code **)((long)*pMVar4 + 0x80))(pMVar4,iVar7);
    (**(code **)(*plVar11 + 0x20))(local_3a0,plVar11);
    poVar9 = std::operator<<(poVar9,local_3a0);
    poVar9 = std::operator<<(poVar9,",");
    pSVar10 = TransitionObservationIndependentMADPDiscrete::GetState
                        (&this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
                          super_TransitionObservationIndependentMADPDiscrete,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_408);
    (*(pSVar10->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[3])(local_3c0,pSVar10);
    poVar9 = std::operator<<(poVar9,local_3c0);
    std::operator<<(poVar9,") (p ");
    dVar13 = TransitionObservationIndependentMADPDiscrete::GetTransitionProbability
                       (&this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
                         super_TransitionObservationIndependentMADPDiscrete,sIs,aIs,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_408);
    poVar9 = std::ostream::_M_insert<double>(dVar13);
    poVar9 = std::operator<<(poVar9,") jo ");
    local_3f0 = sIs;
    std::__cxx11::stringstream::stringstream(local_1b8);
    puVar12 = (oIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar5 = (oIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_3e8 = poVar9;
    std::operator<<(local_1a8,"< ");
    for (; puVar12 != puVar5; puVar12 = puVar12 + 1) {
      if (puVar12 !=
          (oIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        std::operator<<(local_1a8,", ");
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_340);
      std::ostream::_M_insert<unsigned_long>
                ((ulong)&local_340[0]._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
      std::operator<<(local_1a8,local_360);
      std::__cxx11::string::~string(local_360);
    }
    std::operator<<(local_1a8," >");
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    poVar9 = std::operator<<(local_3e8,local_3e0);
    poVar9 = std::operator<<(poVar9," ");
    pPVar3 = this->_m_puTOI;
    pMVar4 = (pPVar3->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete._m_madp;
    uVar8 = (**(code **)((long)*pMVar4 + 0xe0))(pMVar4,oIs);
    sIs = local_3f0;
    pMVar4 = (pPVar3->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete._m_madp;
    plVar11 = (long *)(**(code **)((long)*pMVar4 + 0xd8))(pMVar4,uVar8);
    (**(code **)(*plVar11 + 0x20))(local_340,plVar11);
    poVar9 = std::operator<<(poVar9,(string *)local_340);
    std::operator<<(poVar9," (p ");
    dVar13 = TransitionObservationIndependentMADPDiscrete::GetObservationProbability
                       (&this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
                         super_TransitionObservationIndependentMADPDiscrete,aIs,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_408,oIs);
    poVar9 = std::ostream::_M_insert<double>(dVar13);
    std::operator<<(poVar9,") r ");
    poVar9 = std::ostream::_M_insert<double>(*r);
    std::operator<<(poVar9," sumR ");
    poVar9 = std::ostream::_M_insert<double>(*sumR);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)local_340);
    std::__cxx11::string::~string(local_3e0);
    std::__cxx11::string::~string(local_3c0);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::string::~string(local_380);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (sIs,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_408);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_408);
  return;
}

Assistant:

void SimulationTOIDecPOMDPDiscrete::Step(const std::vector<Index> &aIs, 
                                         unsigned int t,
                                         std::vector<Index> &sIs, 
                                         std::vector<Index> &oIs,
                                         double &r,
                                         double &sumR,
                                         double specialR) const
{
    vector<Index> sIs_suc=_m_puTOI->GetReferred()->
        SampleSuccessorState(sIs,aIs);

    oIs=_m_puTOI->GetReferred()->SampleJointObservation(aIs,sIs_suc);
    r = _m_puTOI->GetReferred()->GetReward(sIs,aIs) + specialR;

    // calc. the discounted reward
    sumR+=r*pow(_m_puTOI->GetDiscount(),static_cast<double>(t));
    
    if(GetVerbose())
        cout << "Simulation::RunSimulation "
#if 0
             << "("
             << SoftPrintVector(sIs) << "," 
             << SoftPrintVector(aIs) << ","
             << SoftPrintVector(sIs_suc) << ") "
#endif
             << "("
             << (_m_puTOI->GetReferred()->GetState(sIs)->SoftPrintBrief())
             << ","
             << (_m_puTOI->GetJointAction(
                     _m_puTOI->IndividualToJointActionIndices(aIs)))
            ->SoftPrintBrief()
             << ","
             << (_m_puTOI->GetReferred()->GetState(sIs_suc)->SoftPrintBrief())
             << ") (p " 
             << _m_puTOI->GetReferred()->
            GetTransitionProbability(sIs,aIs,sIs_suc)
             << ") jo " << SoftPrintVector(oIs) << " "
             << (_m_puTOI->GetJointObservation(
                     _m_puTOI->IndividualToJointObservationIndices(oIs)))
            ->SoftPrintBrief()
             << " (p " 
             << _m_puTOI->GetReferred()->
            GetObservationProbability(aIs,sIs_suc,oIs)
             << ") r " << r << " sumR " << sumR << endl;

    sIs = sIs_suc;
}